

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrTsim.c
# Opt level: O1

void Pdr_ManCollectCone(Aig_Man_t *pAig,Vec_Int_t *vCoObjs,Vec_Int_t *vCiObjs,Vec_Int_t *vNodes)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  Aig_Obj_t *pObj;
  long lVar3;
  
  vCiObjs->nSize = 0;
  vNodes->nSize = 0;
  Aig_ManIncrementTravId(pAig);
  pAig->pConst1->TravId = pAig->nTravIds;
  if (0 < vCoObjs->nSize) {
    lVar3 = 0;
    do {
      pVVar2 = pAig->vObjs;
      if (pVVar2 == (Vec_Ptr_t *)0x0) {
        pObj = (Aig_Obj_t *)0x0;
      }
      else {
        uVar1 = vCoObjs->pArray[lVar3];
        if (((int)uVar1 < 0) || (pVVar2->nSize <= (int)uVar1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pObj = (Aig_Obj_t *)pVVar2->pArray[uVar1];
      }
      Pdr_ManCollectCone_rec(pAig,pObj,vCiObjs,vNodes);
      lVar3 = lVar3 + 1;
    } while (lVar3 < vCoObjs->nSize);
  }
  return;
}

Assistant:

void Pdr_ManCollectCone( Aig_Man_t * pAig, Vec_Int_t * vCoObjs, Vec_Int_t * vCiObjs, Vec_Int_t * vNodes )
{
    Aig_Obj_t * pObj;
    int i;
    Vec_IntClear( vCiObjs );
    Vec_IntClear( vNodes );
    Aig_ManIncrementTravId( pAig );
    Aig_ObjSetTravIdCurrent( pAig, Aig_ManConst1(pAig) );
    Aig_ManForEachObjVec( vCoObjs, pAig, pObj, i )
        Pdr_ManCollectCone_rec( pAig, pObj, vCiObjs, vNodes );
}